

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeParameters.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeParameters::FluctuatingChargeParameters(FluctuatingChargeParameters *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  __a;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar1;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  DataHolder *in_stack_fffffffffffff6b0;
  value_type *in_stack_fffffffffffff6b8;
  value_type *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_fffffffffffff6c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *in_stack_fffffffffffff6e0;
  char *in_stack_fffffffffffff6e8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_6a9 [73];
  double local_660;
  allocator<char> local_651;
  string local_650 [32];
  _Base_ptr local_630;
  undefined1 local_628;
  undefined8 *local_620;
  undefined1 local_611 [79];
  bool local_5c2;
  allocator<char> local_5c1;
  string local_5c0 [32];
  _Base_ptr local_5a0;
  undefined1 local_598;
  undefined8 *local_590;
  allocator<char> local_581;
  string local_580 [72];
  double local_538;
  allocator<char> local_529;
  string local_528 [32];
  _Base_ptr local_508;
  undefined1 local_500;
  undefined8 *local_4f8;
  allocator<char> local_4e9;
  string local_4e8 [72];
  double local_4a0;
  allocator<char> local_491;
  string local_490 [32];
  _Base_ptr local_470;
  undefined1 local_468;
  undefined8 *local_460;
  allocator<char> local_451;
  string local_450 [72];
  double local_408;
  allocator<char> local_3f9;
  string local_3f8 [32];
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  undefined8 *local_3c8;
  allocator<char> local_3b9;
  string local_3b8 [72];
  int local_370;
  allocator<char> local_369;
  string local_368 [32];
  _Base_ptr local_348;
  undefined1 local_340;
  undefined8 *local_338;
  allocator<char> local_329;
  string local_328 [72];
  double local_2e0;
  allocator<char> local_2d1;
  string local_2d0 [32];
  _Base_ptr local_2b0;
  undefined1 local_2a8;
  undefined8 *local_2a0;
  allocator<char> local_291;
  string local_290 [72];
  double local_248;
  allocator<char> local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined8 *local_208;
  allocator<char> local_1f9;
  string local_1f8 [79];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [32];
  _Base_ptr local_160;
  undefined1 local_158;
  undefined8 *local_150;
  allocator<char> local_141;
  string local_140 [78];
  bool local_f2;
  allocator<char> local_f1;
  string local_f0 [32];
  _Base_ptr local_d0;
  undefined1 local_c8;
  undefined8 *local_c0;
  allocator<char> local_b1;
  string local_b0 [79];
  allocator<char> local_61;
  string local_60 [39];
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder(in_stack_fffffffffffff6b0);
  *in_RDI = &PTR__FluctuatingChargeParameters_00501830;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff6b0);
  Parameter<bool>::Parameter((Parameter<bool> *)in_stack_fffffffffffff6b0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff6b0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff6b0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff6b0);
  Parameter<int>::Parameter((Parameter<int> *)in_stack_fffffffffffff6b0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff6b0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff6b0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff6b0);
  Parameter<bool>::Parameter((Parameter<bool> *)in_stack_fffffffffffff6b0);
  Parameter<double>::Parameter((Parameter<double> *)in_stack_fffffffffffff6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xd),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff6b0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_c0 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_d0 = (_Base_ptr)pVar1.first._M_node;
  local_c8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fbda8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x17),true);
  local_f2 = true;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0x17),&local_f2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_150 = in_RDI + 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_160 = (_Base_ptr)pVar1.first._M_node;
  local_158 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fbf4a);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x1d),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff6b0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_208 = in_RDI + 0x1d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_218 = (_Base_ptr)pVar1.first._M_node;
  local_210 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fc140);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x27),true);
  local_248 = 1600.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x27),&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_2a0 = in_RDI + 0x27;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_2b0 = (_Base_ptr)pVar1.first._M_node;
  local_2a8 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fc2ec);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x2e),true);
  local_2e0 = 1e-05;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x2e),&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_338 = in_RDI + 0x2e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_348 = (_Base_ptr)pVar1.first._M_node;
  local_340 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fc498);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator(&local_369);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x35),true);
  local_370 = 100;
  Parameter<int>::setDefaultValue((Parameter<int> *)(in_RDI + 0x35),&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_3c8 = in_RDI + 0x35;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_3d8 = (_Base_ptr)pVar1.first._M_node;
  local_3d0 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fc63d);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x3b),true);
  local_408 = 1e-06;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x3b),&local_408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_460 = in_RDI + 0x3b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_470 = (_Base_ptr)pVar1.first._M_node;
  local_468 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fc7e9);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x42),true);
  local_4a0 = 10.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x42),&local_4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_4f8 = in_RDI + 0x42;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_508 = (_Base_ptr)pVar1.first._M_node;
  local_500 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fc995);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x49),true);
  local_538 = 0.01;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x49),&local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  local_590 = in_RDI + 0x49;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  local_5a0 = (_Base_ptr)pVar1.first._M_node;
  local_598 = pVar1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fcb29);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator(&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x50),true);
  local_5c2 = false;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0x50),&local_5c2);
  __s = (char *)(in_RDI + 1);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_611;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffff6e0);
  local_620 = in_RDI + 0x50;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_fffffffffffff6c0,&in_stack_fffffffffffff6b8->first,
             (ParameterBase **)in_stack_fffffffffffff6b0);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
  __a = pVar1.first._M_node;
  local_628 = pVar1.second;
  local_630 = __a._M_node;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fcca7);
  std::__cxx11::string::~string((string *)(local_611 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_611);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  ParameterBase::setKeyword
            ((ParameterBase *)in_stack_fffffffffffff6b0,
             (string *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator(&local_651);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x56),true);
  local_660 = 0.1;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x56),&local_660);
  __x = (value_type *)(in_RDI + 1);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)local_6a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,(allocator<char> *)__a._M_node);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&__x->first,(ParameterBase **)in_stack_fffffffffffff6b0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,__x);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x1fce2f);
  std::__cxx11::string::~string((string *)(local_6a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_6a9);
  return;
}

Assistant:

FluctuatingChargeParameters::FluctuatingChargeParameters() {
    DefineOptionalParameterWithDefaultValue(Propagator, "propagator", "Damped");
    DefineOptionalParameterWithDefaultValue(DoInitialOptimization,
                                            "doInitialOptimization", true);
    DefineOptionalParameterWithDefaultValue(ChargeOptimizationMethod, "method",
                                            "CG");
    DefineOptionalParameterWithDefaultValue(Friction, "friction", 1600.0);
    DefineOptionalParameterWithDefaultValue(Tolerance, "tolerance", 1.0e-5);
    DefineOptionalParameterWithDefaultValue(MaxIterations, "maxIterations",
                                            100);
    DefineOptionalParameterWithDefaultValue(TargetTemp, "targetTemp", 1.0e-6);
    DefineOptionalParameterWithDefaultValue(TauThermostat, "tauThermostat",
                                            10.0);
    DefineOptionalParameterWithDefaultValue(DragCoefficient, "dragCoefficient",
                                            0.01);
    DefineOptionalParameterWithDefaultValue(ConstrainRegions,
                                            "constrainRegions", false);
    DefineOptionalParameterWithDefaultValue(InitialStepSize, "initialStepSize",
                                            0.1);
  }